

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::sectionEnded
          (CumulativeReporterBase<Catch::SonarQubeReporter> *this,SectionStats *sectionStats)

{
  element_type *peVar1;
  pointer psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_t sVar3;
  size_t sVar4;
  double dVar5;
  
  peVar1 = (this->m_sectionStack).
           super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super___shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__cxx11::string::_M_assign((string *)&(peVar1->stats).sectionInfo);
  std::__cxx11::string::_M_assign((string *)&(peVar1->stats).sectionInfo.description);
  sVar3 = (sectionStats->sectionInfo).lineInfo.line;
  (peVar1->stats).sectionInfo.lineInfo.file = (sectionStats->sectionInfo).lineInfo.file;
  (peVar1->stats).sectionInfo.lineInfo.line = sVar3;
  sVar3 = (sectionStats->assertions).failed;
  sVar4 = (sectionStats->assertions).failedButOk;
  dVar5 = sectionStats->durationInSeconds;
  (peVar1->stats).assertions.passed = (sectionStats->assertions).passed;
  (peVar1->stats).assertions.failed = sVar3;
  (peVar1->stats).assertions.failedButOk = sVar4;
  (peVar1->stats).durationInSeconds = dVar5;
  (peVar1->stats).missingAssertions = sectionStats->missingAssertions;
  psVar2 = (this->m_sectionStack).
           super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_sectionStack).
  super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar2 + -1;
  this_00 = psVar2[-1].
            super___shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void sectionEnded(SectionStats const& sectionStats) override {
            assert(!m_sectionStack.empty());
            SectionNode& node = *m_sectionStack.back();
            node.stats = sectionStats;
            m_sectionStack.pop_back();
        }